

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O2

void soul::
     Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
     appendUTF8(string *target,UnicodeChar charToWrite)

{
  int iVar1;
  
  if (charToWrite < 0x80) {
    std::__cxx11::string::push_back((char)target);
    return;
  }
  iVar1 = 1;
  if (0x7ff < charToWrite) {
    iVar1 = 3 - (uint)(charToWrite < 0x10000);
  }
  for (; std::__cxx11::string::push_back((char)target), 0 < iVar1; iVar1 = iVar1 + -1) {
  }
  return;
}

Assistant:

static void appendUTF8 (std::string& target, UnicodeChar charToWrite)
    {
        auto c = (uint32_t) charToWrite;

        if (c >= 0x80)
        {
            int numExtraBytes = 1;

            if (c >= 0x800)
            {
                ++numExtraBytes;

                if (c >= 0x10000)
                    ++numExtraBytes;
            }

            target += (char) ((uint32_t) (0xff << (7 - numExtraBytes)) | (c >> (numExtraBytes * 6)));

            while (--numExtraBytes >= 0)
                target += (char) (0x80 | (0x3f & (c >> (numExtraBytes * 6))));
        }
        else
        {
            target += (char) c;
        }
    }